

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

void Gia_SimAbsInit(Gia_SimAbsMan_t *p)

{
  Vec_Int_t *p_00;
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *vValue1;
  Vec_Int_t *vValue0;
  int nPairsInit;
  int n;
  Gia_SimAbsMan_t *p_local;
  
  p_01 = Gia_SimAbsFind(p->vValues,0);
  p_02 = Gia_SimAbsFind(p->vValues,1);
  Vec_IntClear(p->vPatPairs);
  uVar1 = Vec_IntSize(p_01);
  uVar2 = Vec_IntSize(p_02);
  iVar3 = Vec_IntSize(p_01);
  iVar4 = Vec_IntSize(p_02);
  printf("There are %d offset and %d onset minterms (%d pairs) and %d divisors.\n",(ulong)uVar1,
         (ulong)uVar2,(ulong)(uint)(iVar3 * iVar4),(ulong)(uint)p->nCands);
  Abc_Random(1);
  iVar3 = Vec_IntSize(p_01);
  if (iVar3 < 1) {
    __assert_fail("Vec_IntSize(vValue0) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x51a,"void Gia_SimAbsInit(Gia_SimAbsMan_t *)");
  }
  iVar3 = Vec_IntSize(p_02);
  if (0 < iVar3) {
    for (vValue0._4_4_ = 0; vValue0._4_4_ < 0x40; vValue0._4_4_ = vValue0._4_4_ + 1) {
      p_00 = p->vPatPairs;
      uVar1 = Abc_Random(0);
      uVar2 = Vec_IntSize(p_01);
      iVar3 = Vec_IntEntry(p_01,uVar1 % uVar2);
      uVar1 = Abc_Random(0);
      uVar2 = Vec_IntSize(p_02);
      iVar4 = Vec_IntEntry(p_02,uVar1 % uVar2);
      Vec_IntPushTwo(p_00,iVar3,iVar4);
    }
    Vec_IntFree(p_01);
    Vec_IntFree(p_02);
    return;
  }
  __assert_fail("Vec_IntSize(vValue1) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                ,0x51b,"void Gia_SimAbsInit(Gia_SimAbsMan_t *)");
}

Assistant:

void Gia_SimAbsInit( Gia_SimAbsMan_t * p )
{
    int n, nPairsInit = 64;
    Vec_Int_t * vValue0 = Gia_SimAbsFind( p->vValues, 0 );
    Vec_Int_t * vValue1 = Gia_SimAbsFind( p->vValues, 1 );
    Vec_IntClear( p->vPatPairs );
    printf( "There are %d offset and %d onset minterms (%d pairs) and %d divisors.\n", 
        Vec_IntSize(vValue0), Vec_IntSize(vValue1), Vec_IntSize(vValue0)*Vec_IntSize(vValue1), p->nCands );
    Abc_Random( 1 );
    assert( Vec_IntSize(vValue0) > 0 );
    assert( Vec_IntSize(vValue1) > 0 );
    for ( n = 0; n < nPairsInit; n++ )
        Vec_IntPushTwo( p->vPatPairs, 
            Vec_IntEntry(vValue0, Abc_Random(0) % Vec_IntSize(vValue0)), 
            Vec_IntEntry(vValue1, Abc_Random(0) % Vec_IntSize(vValue1)) );
    Vec_IntFree( vValue0 );
    Vec_IntFree( vValue1 );
}